

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O0

Result __thiscall Kernel::KBO::State::result(State *this,KBO *kbo,AppliedTerm t1,AppliedTerm t2)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Result RVar6;
  Term *pTVar7;
  PrecedenceOrdering *in_RSI;
  State *in_RDI;
  int prec2;
  int prec1;
  Result res;
  undefined8 in_stack_ffffffffffffffa8;
  uint pred;
  Term *in_stack_ffffffffffffffb0;
  PrecedenceOrdering *in_stack_ffffffffffffffb8;
  Result local_14;
  
  pred = (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (in_RDI->_weightDiff == 0) {
    pTVar7 = TermList::term((TermList *)0x88490e);
    uVar2 = Term::functor(pTVar7);
    pTVar7 = TermList::term((TermList *)0x884924);
    uVar3 = Term::functor(pTVar7);
    if (uVar2 == uVar3) {
      local_14 = in_RDI->_lexResult;
    }
    else {
      TermList::term((TermList *)0x884944);
      bVar1 = Term::isLiteral((Term *)0x88494c);
      if (bVar1) {
        pTVar7 = TermList::term((TermList *)0x884966);
        Term::functor(pTVar7);
        iVar4 = PrecedenceOrdering::predicatePrecedence(in_RSI,pred);
        pTVar7 = TermList::term((TermList *)0x884992);
        Term::functor(pTVar7);
        iVar5 = PrecedenceOrdering::predicatePrecedence(in_RSI,pred);
        local_14 = LESS;
        if (iVar5 < iVar4) {
          local_14 = GREATER;
        }
      }
      else {
        pTVar7 = TermList::term((TermList *)0x8849db);
        TermList::term((TermList *)0x8849ea);
        local_14 = PrecedenceOrdering::comparePrecedences
                             (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,pTVar7);
      }
    }
  }
  else {
    local_14 = LESS;
    if (0 < in_RDI->_weightDiff) {
      local_14 = GREATER;
    }
  }
  RVar6 = applyVariableCondition(in_RDI,local_14);
  return RVar6;
}

Assistant:

Ordering::Result KBO::State::result(KBO const& kbo, AppliedTerm t1, AppliedTerm t2)
{
  Result res;
  if(_weightDiff) {
    res=_weightDiff>0 ? GREATER : LESS;
  } else if(t1.term.term()->functor()!=t2.term.term()->functor()) {
    if(t1.term.term()->isLiteral()) {
      ASS(t2.term.term()->isLiteral());
      int prec1, prec2;
      prec1=kbo.predicatePrecedence(t1.term.term()->functor());
      prec2=kbo.predicatePrecedence(t2.term.term()->functor());
      ASS_NEQ(prec1,prec2);//precedence ordering must be total
      res=(prec1>prec2)?GREATER:LESS;
    } else {
      ASS(!t2.term.term()->isLiteral());
      res=kbo.comparePrecedences(t1.term.term(), t2.term.term());
      ASS_REP(res==GREATER || res==LESS, res); //precedence ordering must be total
    }
  } else {
    res=_lexResult;
  }
  res=applyVariableCondition(res);
  return res;
}